

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O3

bool __thiscall ParsedH265TrackData::spsppsExists(ParsedH265TrackData *this,uint8_t *buff,int size)

{
  uint32_t uVar1;
  ulong uVar2;
  uint32_t *cur32;
  uint32_t *puVar3;
  byte bVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  uVar2 = (ulong)(this->super_ParsedH264TrackData).m_nalSize;
  if (buff < buff + ((long)size - uVar2)) {
    bVar4 = 0;
    bVar7 = 0;
    bVar8 = 0;
    puVar3 = (uint32_t *)buff;
    do {
      if ((char)uVar2 == '\x04') {
        uVar1 = my_ntohl(*puVar3);
        uVar2 = (ulong)(this->super_ParsedH264TrackData).m_nalSize;
      }
      else {
        uVar1 = (uint)*(byte *)((long)puVar3 + 2) |
                (uint)*(byte *)((long)puVar3 + 1) << 8 | (uint)(byte)*puVar3 << 0x10;
      }
      bVar6 = *(byte *)((long)puVar3 + uVar2) >> 1 & 0x3f;
      if (bVar6 == 0x20) {
        bVar4 = 1;
      }
      else if (bVar6 == 0x22) {
        bVar7 = 1;
      }
      else if (bVar6 == 0x21) {
        bVar8 = 1;
      }
      puVar3 = (uint32_t *)((long)puVar3 + (ulong)(uVar1 + (int)uVar2));
    } while (puVar3 < buff + ((long)size - uVar2));
    bVar5 = (bool)(bVar4 & bVar8 & bVar7);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ParsedH265TrackData::spsppsExists(uint8_t* buff, const int size)
{
    uint8_t* curPos = buff;
    const uint8_t* end = buff + size;
    bool vpsFound = false;
    bool spsFound = false;
    bool ppsFound = false;
    while (curPos < end - m_nalSize)
    {
        uint32_t elSize;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        const auto nalUnitType = static_cast<HevcUnit::NalType>((curPos[m_nalSize] >> 1) & 0x3f);
        if (nalUnitType == HevcUnit::NalType::VPS)
            vpsFound = true;
        else if (nalUnitType == HevcUnit::NalType::SPS)
            spsFound = true;
        else if (nalUnitType == HevcUnit::NalType::PPS)
            ppsFound = true;
        curPos += elSize + m_nalSize;
    }
    return vpsFound && spsFound && ppsFound;
}